

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadDirectionalLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  LightNodeImpl<embree::SceneGraph::DirectionalLight> *this_00;
  undefined8 *in_RDX;
  XMLLoader *this_01;
  string *childID;
  Vec3fa VVar1;
  Vec3fa E;
  AffineSpace3fa space;
  allocator local_c9;
  undefined1 local_c8 [8];
  atomic<unsigned_long> aStack_c0;
  _Base_ptr local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  DirectionalLight local_a8;
  undefined1 local_78 [32];
  AffineSpace3fa local_58;
  
  this_01 = (XMLLoader *)*in_RDX;
  std::__cxx11::string::string((string *)&local_a8,"AffineSpace",(allocator *)local_78);
  XML::child((XML *)local_c8,(string *)this_01);
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            (&local_58,this_01,(Ref<embree::XML> *)local_c8);
  if (local_c8 != (undefined1  [8])0x0) {
    (*((RefCount *)local_c8)->_vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&local_a8);
  childID = (string *)*in_RDX;
  std::__cxx11::string::string((string *)&local_a8,"E",&local_c9);
  XML::child((XML *)local_c8,childID);
  VVar1 = load<embree::Vec3fa>((XMLLoader *)local_78,(Ref<embree::XML> *)childID);
  if (local_c8 != (undefined1  [8])0x0) {
    (*((RefCount *)local_c8)->_vptr_RefCount[3])(VVar1.field_0._0_4_,VVar1.field_0._8_4_);
  }
  std::__cxx11::string::~string((string *)&local_a8);
  local_c8 = (undefined1  [8])0x0;
  aStack_c0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x3f800000;
  local_78._16_8_ = local_78._0_8_;
  local_78._24_8_ = local_78._8_8_;
  local_b8 = (_Base_ptr)local_78._0_8_;
  _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_;
  this_00 = (LightNodeImpl<embree::SceneGraph::DirectionalLight> *)
            SceneGraph::LightNodeImpl<embree::SceneGraph::DirectionalLight>::operator_new(0xa0);
  local_a8.D.field_0.m128[0] =
       local_58.l.vx.field_0.m128[0] * 0.0 +
       (float)local_c8._4_4_ * local_58.l.vy.field_0.m128[0] +
       (float)aStack_c0.super___atomic_base<unsigned_long>._M_i * local_58.l.vz.field_0.m128[0];
  local_a8.D.field_0.m128[1] =
       local_58.l.vx.field_0.m128[1] * 0.0 +
       (float)local_c8._4_4_ * local_58.l.vy.field_0.m128[1] +
       (float)aStack_c0.super___atomic_base<unsigned_long>._M_i * local_58.l.vz.field_0.m128[1];
  local_a8.D.field_0.m128[2] =
       local_58.l.vx.field_0.m128[2] * 0.0 +
       (float)local_c8._4_4_ * local_58.l.vy.field_0.m128[2] +
       (float)aStack_c0.super___atomic_base<unsigned_long>._M_i * local_58.l.vz.field_0.m128[2];
  local_a8.D.field_0.m128[3] =
       local_58.l.vx.field_0.m128[3] * 0.0 +
       (float)local_c8._4_4_ * local_58.l.vy.field_0.m128[3] +
       (float)aStack_c0.super___atomic_base<unsigned_long>._M_i * local_58.l.vz.field_0.m128[3];
  local_a8.super_Light.type = LIGHT_DIRECTIONAL;
  local_a8.E.field_0._0_8_ = local_78._16_8_;
  local_a8.E.field_0._8_8_ = local_78._24_8_;
  SceneGraph::LightNodeImpl<embree::SceneGraph::DirectionalLight>::LightNodeImpl(this_00,&local_a8);
  (this->path).filename._M_dataplus._M_p = (pointer)this_00;
  (**(code **)(*(long *)&(this_00->super_LightNode).super_Node.super_RefCount + 0x10))(this_00);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadDirectionalLight(const Ref<XML>& xml) 
  {
    const AffineSpace3fa space = load<AffineSpace3fa>(xml->child("AffineSpace"));
    const Vec3fa E = load<Vec3fa>(xml->child("E"));
    const Vec3fa D = Vec3fa(0,0,1);
    const SceneGraph::DirectionalLight light = SceneGraph::DirectionalLight(D,E);
    return new SceneGraph::LightNodeImpl<SceneGraph::DirectionalLight>(light.transform(space));
  }